

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<float>(uint length)

{
  element_type eVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  float *__p;
  element_type *peVar8;
  undefined8 *puVar9;
  float fVar10;
  int local_310;
  int i_1;
  int local_2fc;
  int i;
  float *v;
  shared_ptr<float> pv;
  uint length_local;
  __m128 a0_2;
  __m128 a0_1;
  __m128 a1;
  __m128 a0;
  uint local_27c;
  element_type *local_278;
  element_type *local_270;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  uint local_18;
  
  pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = length;
  __p = nosimd::common::malloc<float>(length);
  std::shared_ptr<float>::shared_ptr<float,void(*)(float*),void>
            ((shared_ptr<float> *)&v,__p,nosimd::common::free<float>);
  peVar8 = std::__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<float,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2fc = 0;
      local_2fc <
      (int)(uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_2fc = local_2fc + 1) {
    peVar8[local_2fc] = (float)-local_2fc;
  }
  pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_278 = peVar8;
  local_270 = peVar8;
  for (local_27c = (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      7 < (int)local_27c; local_27c = local_27c - 8) {
    uVar3 = *(undefined8 *)local_270;
    uVar4 = *(undefined8 *)(local_270 + 2);
    uVar5 = *(undefined8 *)(local_270 + 4);
    uVar6 = *(undefined8 *)(local_270 + 6);
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar7 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar7 != 0)) {
      sse::internals::abs_ps(float(int))::sign_mask._0_8_ = 0x8000000080000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_8_ = 0x8000000080000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    local_78 = (uint)sse::internals::abs_ps(float(int))::sign_mask._0_8_;
    uStack_74 = SUB84(sse::internals::abs_ps(float(int))::sign_mask._0_8_,4);
    uStack_70 = (uint)sse::internals::abs_ps(float(int))::sign_mask._8_8_;
    uStack_6c = SUB84(sse::internals::abs_ps(float(int))::sign_mask._8_8_,4);
    local_88 = (uint)uVar3;
    uStack_84 = (uint)((ulong)uVar3 >> 0x20);
    uStack_80 = (uint)uVar4;
    uStack_7c = (uint)((ulong)uVar4 >> 0x20);
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar7 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar7 != 0)) {
      sse::internals::abs_ps(float(int))::sign_mask._0_8_ = 0x8000000080000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_8_ = 0x8000000080000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    local_58 = (uint)sse::internals::abs_ps(float(int))::sign_mask._0_8_;
    uStack_54 = SUB84(sse::internals::abs_ps(float(int))::sign_mask._0_8_,4);
    uStack_50 = (uint)sse::internals::abs_ps(float(int))::sign_mask._8_8_;
    uStack_4c = SUB84(sse::internals::abs_ps(float(int))::sign_mask._8_8_,4);
    local_68 = (uint)uVar5;
    uStack_64 = (uint)((ulong)uVar5 >> 0x20);
    uStack_60 = (uint)uVar6;
    uStack_5c = (uint)((ulong)uVar6 >> 0x20);
    *(ulong *)local_278 =
         CONCAT44((uStack_74 ^ 0xffffffff) & uStack_84,(local_78 ^ 0xffffffff) & local_88);
    *(ulong *)(local_278 + 2) =
         CONCAT44((uStack_6c ^ 0xffffffff) & uStack_7c,(uStack_70 ^ 0xffffffff) & uStack_80);
    *(ulong *)(local_278 + 4) =
         CONCAT44((uStack_54 ^ 0xffffffff) & uStack_64,(local_58 ^ 0xffffffff) & local_68);
    *(ulong *)(local_278 + 6) =
         CONCAT44((uStack_4c ^ 0xffffffff) & uStack_5c,(uStack_50 ^ 0xffffffff) & uStack_60);
    local_270 = local_270 + 8;
    local_278 = local_278 + 8;
  }
  if (3 < (int)local_27c) {
    uVar3 = *(undefined8 *)local_270;
    uVar4 = *(undefined8 *)(local_270 + 2);
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar7 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar7 != 0)) {
      sse::internals::abs_ps(float(int))::sign_mask._0_8_ = 0x8000000080000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_8_ = 0x8000000080000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    local_38 = (uint)sse::internals::abs_ps(float(int))::sign_mask._0_8_;
    uStack_34 = SUB84(sse::internals::abs_ps(float(int))::sign_mask._0_8_,4);
    uStack_30 = (uint)sse::internals::abs_ps(float(int))::sign_mask._8_8_;
    uStack_2c = SUB84(sse::internals::abs_ps(float(int))::sign_mask._8_8_,4);
    local_48 = (uint)uVar3;
    uStack_44 = (uint)((ulong)uVar3 >> 0x20);
    uStack_40 = (uint)uVar4;
    uStack_3c = (uint)((ulong)uVar4 >> 0x20);
    *(ulong *)local_278 =
         CONCAT44((uStack_34 ^ 0xffffffff) & uStack_44,(local_38 ^ 0xffffffff) & local_48);
    *(ulong *)(local_278 + 2) =
         CONCAT44((uStack_2c ^ 0xffffffff) & uStack_3c,(uStack_30 ^ 0xffffffff) & uStack_40);
    local_27c = local_27c - 4;
    local_270 = local_270 + 4;
    local_278 = local_278 + 4;
  }
  for (; 0 < (int)local_27c; local_27c = local_27c - 1) {
    eVar1 = *local_270;
    if ((sse::internals::abs_ps(float(int))::sign_mask == '\0') &&
       (iVar7 = __cxa_guard_acquire(&sse::internals::abs_ps(float(int))::sign_mask), iVar7 != 0)) {
      sse::internals::abs_ps(float(int))::sign_mask._0_8_ = 0x8000000080000000;
      sse::internals::abs_ps(float(int))::sign_mask._8_8_ = 0x8000000080000000;
      __cxa_guard_release(&sse::internals::abs_ps(float(int))::sign_mask);
    }
    local_18 = (uint)sse::internals::abs_ps(float(int))::sign_mask._0_8_;
    *local_278 = (element_type)((local_18 ^ 0xffffffff) & (uint)eVar1);
    local_270 = local_270 + 1;
    local_278 = local_278 + 1;
  }
  local_310 = 0;
  do {
    if ((int)(uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <=
        local_310) {
      std::shared_ptr<float>::~shared_ptr((shared_ptr<float> *)&v);
      return;
    }
    if (peVar8[local_310] <= 0.0 && peVar8[local_310] != 0.0) {
      fVar2 = peVar8[local_310];
      fVar10 = std::numeric_limits<float>::min();
      if ((fVar2 != fVar10) || (NAN(fVar2) || NAN(fVar10))) {
        puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar9 = "void test_abs(unsigned int) [T = float]";
        *(undefined4 *)(puVar9 + 1) = 0x81;
        *(uint *)((long)puVar9 + 0xc) =
             (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        __cxa_throw(puVar9,&Exception::typeinfo,0);
      }
    }
    local_310 = local_310 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}